

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O1

deUint32 __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::getIndex(PrimitiveRestartCase *this,int indexNdx)

{
  IndexType IVar1;
  deUint32 dVar2;
  
  IVar1 = this->m_indexType;
  if (IVar1 == INDEX_UNSIGNED_INT) {
    dVar2 = (this->m_indicesUI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[indexNdx];
  }
  else {
    if (IVar1 == INDEX_UNSIGNED_SHORT) {
      return (deUint32)
             (this->m_indicesUS).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
             ._M_impl.super__Vector_impl_data._M_start[indexNdx];
    }
    dVar2 = 0;
    if (IVar1 == INDEX_UNSIGNED_BYTE) {
      return (deUint32)
             (this->m_indicesUB).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start[indexNdx];
    }
  }
  return dVar2;
}

Assistant:

deUint32 PrimitiveRestartCase::getIndex (int indexNdx)
{
	switch (m_indexType)
	{
		case INDEX_UNSIGNED_BYTE:	return (deUint32)m_indicesUB[indexNdx];
		case INDEX_UNSIGNED_SHORT:	return (deUint32)m_indicesUS[indexNdx];
		case INDEX_UNSIGNED_INT:	return m_indicesUI[indexNdx];
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}